

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_ai_lookup.hpp
# Opt level: O2

void __thiscall PatchOptimizeAILookup::load_from_rom(PatchOptimizeAILookup *this,ROM *rom)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  pointer ppVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  value_type local_18;
  
  local_18.first = 0xffffffff;
  local_18.second = 0xffffffff;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::resize(&this->_ai_addrs_for_enemy_id,0xfe,&local_18);
  puVar3 = (rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->_ai_addrs_for_enemy_id).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  while( true ) {
    uVar7 = *(ushort *)(puVar3 + (uVar6 & 0xffff) * 2 + 0x1a8418) << 8 |
            *(ushort *)(puVar3 + (uVar6 & 0xffff) * 2 + 0x1a8418) >> 8;
    if (uVar7 == 0xffff) break;
    iVar5 = (int)(uVar6 & 0xffff);
    uVar8 = iVar5 * 8;
    bVar1 = puVar3[(ulong)uVar8 + 0x1a84ac];
    bVar2 = puVar3[(ulong)uVar8 + 0x1a84ad];
    ppVar4[uVar7].first =
         ((int)(short)((ushort)puVar3[(ulong)uVar8 + 0x1a84a8] << 8) |
         (uint)puVar3[(ulong)uVar8 + 0x1a84a9]) + uVar8 + 0x1a84a8;
    ppVar4[uVar7].second = ((int)(short)((ushort)bVar1 << 8) | (uint)bVar2) + uVar8 + 0x1a84ac;
    uVar6 = (ulong)(iVar5 + 1);
  }
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _ai_addrs_for_enemy_id.resize(0xFE, std::make_pair(0xFFFFFFFF, 0xFFFFFFFF));

        uint16_t i = 0;
        while(rom.get_word(offsets::ENEMY_AI_TABLE + (i*2)) != 0xFFFF)
        {
            uint16_t enemy_id = rom.get_word(offsets::ENEMY_AI_TABLE + (i*2));

            uint32_t branch_instruction_addr = offsets::ENEMY_AI_JUMP_TABLE + (i*8);
            int16_t jump_offset_A = (int16_t)rom.get_word(branch_instruction_addr + 2);
            uint32_t jump_destination_A = branch_instruction_addr + 2 + jump_offset_A;

            branch_instruction_addr += 4;
            int16_t jump_offset_B = (int16_t)rom.get_word(branch_instruction_addr + 2);
            uint32_t jump_destination_B = branch_instruction_addr + 2 + jump_offset_B;

            _ai_addrs_for_enemy_id[enemy_id] = std::make_pair(jump_destination_A, jump_destination_B);
            ++i;
        }
    }